

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::SVInt>::emplaceRealloc<slang::SVInt&>
          (SmallVectorBase<slang::SVInt> *this,pointer pos,SVInt *args)

{
  SVInt *this_00;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  size_type sVar5;
  pointer pSVar6;
  pointer pSVar7;
  byte *pbVar8;
  pointer pSVar9;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar10;
  ulong uVar11;
  EVP_PKEY_CTX *ctx;
  long lVar12;
  
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar11 = this->len + 1;
  uVar4 = this->cap;
  if (uVar11 < uVar4 * 2) {
    uVar11 = uVar4 * 2;
  }
  if (0x7ffffffffffffff - uVar4 < uVar4) {
    uVar11 = 0x7ffffffffffffff;
  }
  lVar12 = (long)pos - (long)this->data_;
  pSVar6 = (pointer)operator_new(uVar11 << 4);
  this_00 = (SVInt *)((long)pSVar6 + lVar12);
  SVInt::SVInt(this_00,&args->super_SVIntStorage);
  pSVar7 = this->data_;
  sVar5 = this->len;
  ctx = (EVP_PKEY_CTX *)(pSVar7 + sVar5);
  if (ctx == (EVP_PKEY_CTX *)pos) {
    pSVar9 = pSVar6;
    if (sVar5 != 0) {
      do {
        uVar3 = (pSVar7->super_SVIntStorage).bitWidth;
        bVar1 = (pSVar7->super_SVIntStorage).signFlag;
        ctx = (EVP_PKEY_CTX *)CONCAT71((int7)((ulong)ctx >> 8),bVar1);
        bVar2 = (pSVar7->super_SVIntStorage).unknownFlag;
        (pSVar9->super_SVIntStorage).field_0.val = 0;
        (pSVar9->super_SVIntStorage).bitWidth = uVar3;
        (pSVar9->super_SVIntStorage).signFlag = bVar1;
        (pSVar9->super_SVIntStorage).unknownFlag = bVar2;
        if (uVar3 < 0x41 && (bVar2 & 1U) == 0) {
          aVar10 = (pSVar7->super_SVIntStorage).field_0;
        }
        else {
          aVar10 = (pSVar7->super_SVIntStorage).field_0;
          (pSVar7->super_SVIntStorage).field_0.val = 0;
        }
        (pSVar9->super_SVIntStorage).field_0 = aVar10;
        pSVar7 = pSVar7 + 1;
        pSVar9 = pSVar9 + 1;
      } while (pSVar7 != pos);
    }
  }
  else {
    pSVar9 = pSVar6;
    if (pSVar7 != pos) {
      do {
        uVar3 = (pSVar7->super_SVIntStorage).bitWidth;
        bVar1 = (pSVar7->super_SVIntStorage).signFlag;
        bVar2 = (pSVar7->super_SVIntStorage).unknownFlag;
        (pSVar9->super_SVIntStorage).field_0.val = 0;
        (pSVar9->super_SVIntStorage).bitWidth = uVar3;
        (pSVar9->super_SVIntStorage).signFlag = bVar1;
        (pSVar9->super_SVIntStorage).unknownFlag = bVar2;
        if (uVar3 < 0x41 && (bVar2 & 1U) == 0) {
          ctx = (EVP_PKEY_CTX *)(pSVar7->super_SVIntStorage).field_0.val;
        }
        else {
          ctx = (EVP_PKEY_CTX *)(pSVar7->super_SVIntStorage).field_0.val;
          (pSVar7->super_SVIntStorage).field_0.val = 0;
        }
        (pSVar9->super_SVIntStorage).field_0.val = (uint64_t)ctx;
        pSVar7 = pSVar7 + 1;
        pSVar9 = pSVar9 + 1;
      } while (pSVar7 != pos);
      pSVar7 = this->data_;
    }
    if (pSVar7 + sVar5 != pos) {
      pbVar8 = (byte *)((long)pSVar6 + lVar12 + 0x1d);
      do {
        uVar3 = (pos->super_SVIntStorage).bitWidth;
        bVar1 = (pos->super_SVIntStorage).signFlag;
        ctx = (EVP_PKEY_CTX *)CONCAT71((int7)((ulong)ctx >> 8),bVar1);
        bVar2 = (pos->super_SVIntStorage).unknownFlag;
        *(uint *)(pbVar8 + -5) = uVar3;
        pbVar8[-1] = bVar1;
        *pbVar8 = bVar2;
        if (uVar3 < 0x41 && (bVar2 & 1U) == 0) {
          aVar10 = (pos->super_SVIntStorage).field_0;
        }
        else {
          aVar10 = (pos->super_SVIntStorage).field_0;
          (pos->super_SVIntStorage).field_0.val = 0;
        }
        *(anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)(pbVar8 + -0xd) = aVar10;
        pos = pos + 1;
        pbVar8 = pbVar8 + 0x10;
      } while (pos != pSVar7 + sVar5);
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = uVar11;
  this->data_ = pSVar6;
  return this_00;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}